

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O0

int lws_urldecode_spa_cb(lws_spa *spa,char *name,char **buf,int len,int final)

{
  int iVar1;
  char *pcVar2;
  char *local_60;
  int n;
  int final_local;
  int len_local;
  char **buf_local;
  char *name_local;
  lws_spa *spa_local;
  
  if ((final == 3) || (spa->s->content_disp_filename[0] != '\0')) {
    if ((spa->i).opt_cb != (lws_spa_fileupload_cb)0x0) {
      if (buf == (char **)0x0) {
        local_60 = (char *)0x0;
      }
      else {
        local_60 = *buf;
      }
      iVar1 = (*(spa->i).opt_cb)((spa->i).opt_data,name,spa->s->content_disp_filename,local_60,len,
                                 final);
      if (iVar1 < 0) {
        return -1;
      }
    }
  }
  else {
    iVar1 = lws_urldecode_spa_lookup(spa,name);
    if ((iVar1 != -1) && (len != 0)) {
      if ((spa->i).ac == (lwsac **)0x0) {
        if (spa->params[iVar1] == (char *)0x0) {
          spa->params[iVar1] = *buf;
        }
        if (spa->end <= *buf + len) {
          _lws_log(8,"%s: exceeded storage\n","lws_urldecode_spa_cb");
          return -1;
        }
        *buf = *buf + len;
        pcVar2 = *buf;
        *buf = pcVar2 + 1;
        *pcVar2 = '\0';
        spa->s->out_len = spa->s->out_len - (len + 1);
      }
      else {
        pcVar2 = (char *)lwsac_use((spa->i).ac,(ulong)(len + 1),(spa->i).ac_chunk_size);
        spa->params[iVar1] = pcVar2;
        if (spa->params[iVar1] == (char *)0x0) {
          return -1;
        }
        memcpy(spa->params[iVar1],*buf,(ulong)(uint)len);
        spa->params[iVar1][len] = '\0';
      }
      spa->param_length[iVar1] = len + spa->param_length[iVar1];
    }
  }
  return 0;
}

Assistant:

static int
lws_urldecode_spa_cb(struct lws_spa *spa, const char *name, char **buf, int len,
		     int final)
{
	int n;

	if (final == LWS_UFS_CLOSE || spa->s->content_disp_filename[0]) {
		if (spa->i.opt_cb) {
			n = spa->i.opt_cb(spa->i.opt_data, name,
					spa->s->content_disp_filename,
					buf ? *buf : NULL, len, (enum lws_spa_fileupload_states)final);

			if (n < 0)
				return -1;
		}
		return 0;
	}
	n = lws_urldecode_spa_lookup(spa, name);
	if (n == -1 || !len) /* unrecognized */
		return 0;

	if (!spa->i.ac) {
		if (!spa->params[n])
			spa->params[n] = *buf;

		if ((*buf) + len >= spa->end) {
			lwsl_info("%s: exceeded storage\n", __func__);
			return -1;
		}

		/* move it on inside storage */
		(*buf) += len;
		*((*buf)++) = '\0';

		spa->s->out_len -= len + 1;
	} else {
		spa->params[n] = lwsac_use(spa->i.ac, (unsigned int)len + 1,
					   spa->i.ac_chunk_size);
		if (!spa->params[n])
			return -1;

		memcpy(spa->params[n], *buf, (unsigned int)len);
		spa->params[n][len] = '\0';
	}

	spa->param_length[n] += len;

	return 0;
}